

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O0

void GetSmoke(Pixel *pixel)

{
  byte bVar1;
  int iVar2;
  undefined1 *in_RDI;
  uint8_t randomColorIndex;
  
  iVar2 = rand();
  bVar1 = (byte)(iVar2 % 5);
  *(undefined4 *)(in_RDI + 4) = 5;
  in_RDI[3] = 0xff;
  *in_RDI = (char)smokeColors[smokeColorsIndexes[bVar1]];
  in_RDI[1] = (char)smokeColors[smokeColorsIndexes[bVar1] + 1];
  in_RDI[2] = (char)smokeColors[smokeColorsIndexes[bVar1] + 2];
  *(undefined4 *)(in_RDI + 0xc) = 0;
  in_RDI[0x10] = 0;
  return;
}

Assistant:

void GetSmoke(struct Pixel* pixel) {
    uint8_t randomColorIndex = rand() % 5;
    pixel->pixelType = Smoke;
    pixel->color.a = 255;
    pixel->color.r = smokeColors[smokeColorsIndexes[randomColorIndex]];
    pixel->color.g = smokeColors[smokeColorsIndexes[randomColorIndex] + 1];
    pixel->color.b = smokeColors[smokeColorsIndexes[randomColorIndex] + 2];
    pixel->density = 0;
    pixel->flameable = false;
}